

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void __thiscall
HACD::MyMicroAllocator::MyMicroAllocator
          (MyMicroAllocator *this,MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)

{
  MemoryHeader *pMVar1;
  MemoryHeader *pMVar2;
  undefined8 *puVar3;
  NxU32 *pNVar4;
  long lVar5;
  ulong uVar6;
  NxU8 *pNVar7;
  uint uVar8;
  long lVar9;
  MemoryHeader *next;
  MemoryHeader *pMVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR___cxa_pure_virtual_00b42598
  ;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate =
       (_func_int **)&PTR___cxa_pure_virtual_00b425c8;
  MemMutex::MemMutex(&this->super_MemMutex);
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR_malloc_00b424c0;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate = (_func_int **)&PTR_addMicroChunk_00b42500;
  pNVar4 = &this->mAlloc[0].mChunks.mChunks[0].mChunkSize;
  lVar5 = 0x888;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)pNVar4 + lVar9 + -8) = 0;
      *(undefined1 *)((long)pNVar4 + lVar9 + -0x28) = 0;
      *(undefined4 *)((long)pNVar4 + lVar9) = 0;
      puVar3 = (undefined8 *)((long)pNVar4 + lVar9 + -0x20);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined4 *)((long)pNVar4 + lVar9 + -0x10) = 0;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0x600);
    lVar9 = lVar5 + 0x630;
    pNVar4 = pNVar4 + 0x18c;
    *(undefined8 *)((long)this->mFixedAllocators + lVar5 + -0x30) = 0;
    *(undefined8 *)((long)this->mFixedAllocators + lVar5 + -0x28) = 0;
    *(undefined8 *)((long)this->mFixedAllocators + lVar5 + -0x40) = 0;
    lVar5 = lVar9;
  } while (lVar9 != 0x2da8);
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar12 = vpbroadcastq_avx512f(ZEXT816(9));
  auVar15 = ZEXT416(0) << 0x40;
  this->mMicroChunks = (MicroChunk *)0x0;
  this->mMaxMicroChunks = auVar15._0_4_;
  this->mMicroChunkCount = auVar15._4_4_;
  this->mLastMicroChunk = (MicroChunk *)auVar15._8_8_;
  auVar13 = vpbroadcastq_avx512f();
  this->mHeap = heap;
  lVar5 = 0;
  this->mChunkSize = chunkSize;
  do {
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vporq_avx512f(auVar14,auVar11);
    vpcmpuq_avx512f(auVar14,auVar12,1);
    auVar14 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])(this->mFixedAllocators + lVar5) = auVar14;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  auVar11 = vpbroadcastq_avx512f();
  auVar12 = vpbroadcastq_avx512f();
  auVar11 = vmovdqu64_avx512f(auVar11);
  *(undefined1 (*) [64])(this->mFixedAllocators + 9) = auVar11;
  auVar13 = vpbroadcastq_avx512f();
  auVar11 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])(this->mFixedAllocators + 0x11) = auVar11;
  lVar5 = 0;
  auVar11 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])(this->mFixedAllocators + 0x19) = auVar11;
  do {
    auVar11 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])(this->mFixedAllocators + lVar5 + 0x21) = auVar11;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  auVar11 = vpbroadcastq_avx512f();
  lVar5 = 0;
  do {
    auVar12 = vmovdqu64_avx512f(auVar11);
    *(undefined1 (*) [64])(this->mFixedAllocators + lVar5 + 0x41) = auVar12;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x40);
  auVar11 = vpbroadcastq_avx512f();
  lVar5 = 0;
  do {
    auVar12 = vmovdqu64_avx512f(auVar11);
    *(undefined1 (*) [64])(this->mFixedAllocators + lVar5 + 0x81) = auVar12;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x80);
  this->mBaseMem = (NxU8 *)baseMem;
  uVar6 = (ulong)chunkSize;
  uVar8 = chunkSize >> 3;
  pMVar10 = (MemoryHeader *)((long)baseMem + 0x2dc8U & 0xfffffffffffffff0);
  this->mBaseMemEnd = (NxU8 *)((ulong)initialSize + (long)baseMem);
  pMVar1 = (MemoryHeader *)((long)&pMVar10->mNext + uVar6);
  this->mChunkStart = (NxU8 *)pMVar10;
  this->mAlloc[0].mMemBegin = (NxU8 *)pMVar10;
  this->mAlloc[0].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[0].mChunks.mHeap = heap;
  this->mAlloc[0].mChunks.mChunkSize = 8;
  this->mAlloc[0].mChunks.mMaxChunks = uVar8;
  this->mAlloc[0].mCurrent = this->mAlloc[0].mChunks.mChunks;
  this->mAlloc[0].mChunks.mChunks[0].mChunkSize = 8;
  this->mAlloc[0].mChunks.mChunks[0].mData = (NxU8 *)pMVar10;
  this->mAlloc[0].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar10->mNext + (ulong)(chunkSize & 0xfffffff8));
  this->mAlloc[0].mChunks.mChunks[0].mFreeList = pMVar10;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar10->mNext = pMVar10 + 1;
    pMVar10 = pMVar10 + 1;
  }
  pMVar2 = (MemoryHeader *)((long)&pMVar1->mNext + uVar6);
  uVar8 = chunkSize >> 4;
  pMVar10->mNext = (MemoryHeader *)0x0;
  this->mAlloc[1].mMemBegin = (NxU8 *)pMVar1;
  this->mAlloc[1].mMemEnd = (NxU8 *)pMVar2;
  this->mAlloc[1].mChunks.mHeap = heap;
  this->mAlloc[1].mChunks.mChunkSize = 0x10;
  this->mAlloc[1].mChunks.mMaxChunks = uVar8;
  this->mAlloc[1].mCurrent = this->mAlloc[1].mChunks.mChunks;
  this->mAlloc[1].mChunks.mChunks[0].mChunkSize = 0x10;
  this->mAlloc[1].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[1].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xfffffff0));
  this->mAlloc[1].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar1->mNext = pMVar1 + 2;
    pMVar1 = pMVar1 + 2;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  pMVar1 = (MemoryHeader *)((long)&pMVar2->mNext + uVar6);
  uVar8 = chunkSize >> 5;
  this->mAlloc[2].mMemBegin = (NxU8 *)pMVar2;
  this->mAlloc[2].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[2].mChunks.mHeap = heap;
  this->mAlloc[2].mChunks.mChunkSize = 0x20;
  this->mAlloc[2].mChunks.mMaxChunks = uVar8;
  this->mAlloc[2].mCurrent = this->mAlloc[2].mChunks.mChunks;
  this->mAlloc[2].mChunks.mChunks[0].mChunkSize = 0x20;
  this->mAlloc[2].mChunks.mChunks[0].mData = (NxU8 *)pMVar2;
  this->mAlloc[2].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar2->mNext + (ulong)(chunkSize & 0xffffffe0));
  this->mAlloc[2].mChunks.mChunks[0].mFreeList = pMVar2;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar2->mNext = pMVar2 + 4;
    pMVar2 = pMVar2 + 4;
  }
  pMVar2->mNext = (MemoryHeader *)0x0;
  pMVar10 = (MemoryHeader *)((long)&pMVar1->mNext + uVar6);
  uVar8 = chunkSize >> 6;
  this->mAlloc[3].mMemBegin = (NxU8 *)pMVar1;
  this->mAlloc[3].mMemEnd = (NxU8 *)pMVar10;
  this->mAlloc[3].mChunks.mHeap = heap;
  this->mAlloc[3].mChunks.mChunkSize = 0x40;
  this->mAlloc[3].mChunks.mMaxChunks = uVar8;
  this->mAlloc[3].mCurrent = this->mAlloc[3].mChunks.mChunks;
  this->mAlloc[3].mChunks.mChunks[0].mChunkSize = 0x40;
  this->mAlloc[3].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[3].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xffffffc0));
  this->mAlloc[3].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar1->mNext = pMVar1 + 8;
    pMVar1 = pMVar1 + 8;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  pMVar1 = (MemoryHeader *)((long)&pMVar10->mNext + uVar6);
  uVar8 = chunkSize >> 7;
  this->mAlloc[4].mMemBegin = (NxU8 *)pMVar10;
  this->mAlloc[4].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[4].mChunks.mHeap = heap;
  this->mAlloc[4].mChunks.mChunkSize = 0x80;
  this->mAlloc[4].mChunks.mMaxChunks = uVar8;
  this->mAlloc[4].mCurrent = this->mAlloc[4].mChunks.mChunks;
  this->mAlloc[4].mChunks.mChunks[0].mChunkSize = 0x80;
  this->mAlloc[4].mChunks.mChunks[0].mData = (NxU8 *)pMVar10;
  this->mAlloc[4].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar10->mNext + (ulong)(chunkSize & 0xffffff80));
  this->mAlloc[4].mChunks.mChunks[0].mFreeList = pMVar10;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar10->mNext = pMVar10 + 0x10;
    pMVar10 = pMVar10 + 0x10;
  }
  pNVar7 = (NxU8 *)((long)&pMVar1->mNext + uVar6);
  uVar8 = chunkSize >> 8;
  pMVar10->mNext = (MemoryHeader *)0x0;
  this->mAlloc[5].mMemBegin = (NxU8 *)pMVar1;
  this->mAlloc[5].mMemEnd = pNVar7;
  this->mAlloc[5].mChunks.mHeap = heap;
  this->mAlloc[5].mChunks.mChunkSize = 0x100;
  this->mAlloc[5].mChunks.mMaxChunks = uVar8;
  this->mAlloc[5].mCurrent = this->mAlloc[5].mChunks.mChunks;
  this->mAlloc[5].mChunks.mChunks[0].mChunkSize = 0x100;
  this->mAlloc[5].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[5].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xffffff00));
  this->mAlloc[5].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar8 = uVar8 - 1, uVar8 != 0) {
    pMVar1->mNext = pMVar1 + 0x20;
    pMVar1 = pMVar1 + 0x20;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  this->mChunkEnd = pNVar7;
  if ((NxU8 *)((ulong)initialSize + (long)baseMem) < pNVar7) {
    __assert_fail("chunkBase <= mBaseMemEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                  ,0x1b2,
                  "HACD::MyMicroAllocator::MyMicroAllocator(MicroHeap *, void *, NxU32, NxU32)");
  }
  return;
}

Assistant:

MyMicroAllocator(MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)
  {
    mLastMicroChunk     = 0;
    mMicroChunks        = 0;
    mMicroChunkCount    = 0;
    mMaxMicroChunks		= 0;
	mHeap               = heap;
	mChunkSize          = chunkSize;

    // 0 through 8 bytes
    for (NxU32 i=0; i<=8; i++)
    {
        mFixedAllocators[i] = &mAlloc[0];
    }

    // 9 through 16 bytes
    for (NxU32 i=9; i<=16; i++)
    {
        mFixedAllocators[i] = &mAlloc[1];
    }

    // 17 through 32 bytes
    for (NxU32 i=17; i<=32; i++)
    {
        mFixedAllocators[i] = &mAlloc[2];
    }

    // 33 through 64
    for (NxU32 i=33; i<=64; i++)
    {
        mFixedAllocators[i] = &mAlloc[3];
    }

    // 65 through 128
    for (NxU32 i=65; i<=128; i++)
    {
        mFixedAllocators[i] = &mAlloc[4];
    }

    // 129 through 255
    for (NxU32 i=129; i<257; i++)
    {
        mFixedAllocators[i] = &mAlloc[5];
    }

    mBaseMem = (NxU8 *)baseMem;
    mBaseMemEnd = mBaseMem+initialSize;

    NxU8 *chunkBase = (NxU8 *)baseMem+sizeof(MyMicroAllocator);


    chunkBase+=32;
	NxU64 ptr = (NxU64)chunkBase;
	ptr = ptr>>4;
	ptr = ptr<<4; // make sure it is 16 byte aligned.
	chunkBase = (NxU8 *)ptr;

    mChunkStart = chunkBase;
    chunkBase = mAlloc[0].init(chunkBase,8,chunkSize,heap);
    chunkBase = mAlloc[1].init(chunkBase,16,chunkSize,heap);
    chunkBase = mAlloc[2].init(chunkBase,32,chunkSize,heap);
    chunkBase = mAlloc[3].init(chunkBase,64,chunkSize,heap);
    chunkBase = mAlloc[4].init(chunkBase,128,chunkSize,heap);
    chunkBase = mAlloc[5].init(chunkBase,256,chunkSize,heap);
	mChunkEnd = chunkBase;

    assert(chunkBase <= mBaseMemEnd );

  }